

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipaddr.c
# Opt level: O2

int main(void)

{
  uint __line;
  int iVar1;
  char *__function;
  char *__assertion;
  undefined1 auVar2 [16];
  lrtr_ip_addr addr;
  char buf [16];
  undefined4 local_28;
  
  lrtr_ip_str_to_addr("0.0.0.0",&addr);
  if (CONCAT13(addr.ver._3_1_,CONCAT12(addr.ver._2_1_,CONCAT11(addr.ver._1_1_,(undefined1)addr.ver))
              ) == 0) {
    if (CONCAT13(addr.u.addr4.addr._3_1_,
                 CONCAT12(addr.u.addr4.addr._2_1_,
                          CONCAT11(addr.u.addr4.addr._1_1_,addr.u.addr4.addr._0_1_))) == 0) {
      lrtr_ip_addr_to_str(&addr,buf,0x10);
      if (CONCAT17(buf[7],CONCAT16(buf[6],CONCAT15(buf[5],CONCAT14(buf[4],CONCAT13(buf[3],CONCAT12(
                                                  buf[2],CONCAT11(buf[1],buf[0]))))))) ==
          0x302e302e302e30) {
        lrtr_ip_str_to_addr("255.255.255.255",&addr);
        if (CONCAT13(addr.ver._3_1_,
                     CONCAT12(addr.ver._2_1_,CONCAT11(addr.ver._1_1_,(undefined1)addr.ver))) == 0) {
          if (CONCAT13(addr.u.addr4.addr._3_1_,
                       CONCAT12(addr.u.addr4.addr._2_1_,
                                CONCAT11(addr.u.addr4.addr._1_1_,addr.u.addr4.addr._0_1_))) == -1) {
            lrtr_ip_addr_to_str(&addr,buf,0x10);
            auVar2[0] = -(buf[0] == '2');
            auVar2[1] = -(buf[1] == '5');
            auVar2[2] = -(buf[2] == '5');
            auVar2[3] = -(buf[3] == '.');
            auVar2[4] = -(buf[4] == '2');
            auVar2[5] = -(buf[5] == '5');
            auVar2[6] = -(buf[6] == '5');
            auVar2[7] = -(buf[7] == '.');
            auVar2[8] = -(buf[8] == '2');
            auVar2[9] = -(buf[9] == '5');
            auVar2[10] = -(buf[10] == '5');
            auVar2[0xb] = -(buf[0xb] == '.');
            auVar2[0xc] = -(buf[0xc] == '2');
            auVar2[0xd] = -(buf[0xd] == '5');
            auVar2[0xe] = -(buf[0xe] == '5');
            auVar2[0xf] = -(buf[0xf] == '\0');
            if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar2[0xf] >> 7) << 0xf) == 0xffff) {
              lrtr_ip_str_to_addr("0.2.6.7",&addr);
              if (CONCAT13(addr.ver._3_1_,
                           CONCAT12(addr.ver._2_1_,CONCAT11(addr.ver._1_1_,(undefined1)addr.ver)))
                  == 0) {
                if (CONCAT13(addr.u.addr4.addr._3_1_,
                             CONCAT12(addr.u.addr4.addr._2_1_,
                                      CONCAT11(addr.u.addr4.addr._1_1_,addr.u.addr4.addr._0_1_))) ==
                    0x20607) {
                  lrtr_ip_addr_to_str(&addr,buf,0x10);
                  if (CONCAT17(buf[7],CONCAT16(buf[6],CONCAT15(buf[5],CONCAT14(buf[4],CONCAT13(buf[3
                                                  ],CONCAT12(buf[2],CONCAT11(buf[1],buf[0]))))))) ==
                      0x372e362e322e30) {
                    lrtr_ip_str_to_addr("78.69.255.0",&addr);
                    if (CONCAT13(addr.ver._3_1_,
                                 CONCAT12(addr.ver._2_1_,
                                          CONCAT11(addr.ver._1_1_,(undefined1)addr.ver))) == 0) {
                      if (CONCAT13(addr.u.addr4.addr._3_1_,
                                   CONCAT12(addr.u.addr4.addr._2_1_,
                                            CONCAT11(addr.u.addr4.addr._1_1_,addr.u.addr4.addr._0_1_
                                                    ))) == 0x4e45ff00) {
                        lrtr_ip_addr_to_str(&addr,buf,0x10);
                        iVar1 = bcmp("78.69.255.0",buf,0xc);
                        if (iVar1 == 0) {
                          lrtr_ip_str_to_addr("1.1.1.1",&addr);
                          if (CONCAT13(addr.ver._3_1_,
                                       CONCAT12(addr.ver._2_1_,
                                                CONCAT11(addr.ver._1_1_,(undefined1)addr.ver))) == 0
                             ) {
                            if (CONCAT13(addr.u.addr4.addr._3_1_,
                                         CONCAT12(addr.u.addr4.addr._2_1_,
                                                  CONCAT11(addr.u.addr4.addr._1_1_,
                                                           addr.u.addr4.addr._0_1_))) == 0x1010101)
                            {
                              lrtr_ip_addr_to_str(&addr,buf,0x10);
                              if (CONCAT17(buf[7],CONCAT16(buf[6],CONCAT15(buf[5],CONCAT14(buf[4],
                                                  CONCAT13(buf[3],CONCAT12(buf[2],CONCAT11(buf[1],
                                                  buf[0]))))))) == 0x312e312e312e31) {
                                lrtr_ip_str_to_addr("5.0.255.255",&addr);
                                if (CONCAT13(addr.ver._3_1_,
                                             CONCAT12(addr.ver._2_1_,
                                                      CONCAT11(addr.ver._1_1_,(undefined1)addr.ver))
                                            ) == 0) {
                                  if (CONCAT13(addr.u.addr4.addr._3_1_,
                                               CONCAT12(addr.u.addr4.addr._2_1_,
                                                        CONCAT11(addr.u.addr4.addr._1_1_,
                                                                 addr.u.addr4.addr._0_1_))) ==
                                      0x500ffff) {
                                    lrtr_ip_addr_to_str(&addr,buf,0x10);
                                    iVar1 = bcmp("5.0.255.255",buf,0xc);
                                    if (iVar1 == 0) {
                                      lrtr_ip_str_to_addr("8.9.6.3",&addr);
                                      if (CONCAT13(addr.ver._3_1_,
                                                   CONCAT12(addr.ver._2_1_,
                                                            CONCAT11(addr.ver._1_1_,
                                                                     (undefined1)addr.ver))) == 0) {
                                        if (CONCAT13(addr.u.addr4.addr._3_1_,
                                                     CONCAT12(addr.u.addr4.addr._2_1_,
                                                              CONCAT11(addr.u.addr4.addr._1_1_,
                                                                       addr.u.addr4.addr._0_1_))) ==
                                            0x8090603) {
                                          lrtr_ip_addr_to_str(&addr,buf,0x10);
                                          if (CONCAT17(buf[7],CONCAT16(buf[6],CONCAT15(buf[5],
                                                  CONCAT14(buf[4],CONCAT13(buf[3],CONCAT12(buf[2],
                                                  CONCAT11(buf[1],buf[0]))))))) == 0x332e362e392e38)
                                          {
                                            iVar1 = lrtr_ip_str_to_addr("8,3,4,5",&addr);
                                            if (iVar1 == -1) {
                                              iVar1 = lrtr_ip_str_to_addr("8.4.5",&addr);
                                              if (iVar1 == -1) {
                                                lrtr_ip_str_to_addr("fdf8:f53b:82e4::53",
                                                                    (lrtr_ip_addr *)buf);
                                                if (CONCAT13(buf[7],CONCAT12(buf[6],CONCAT11(buf[5],
                                                  buf[4]))) == -0x2070ac5) {
                                                  if (CONCAT13(buf[0xb],CONCAT12(buf[10],CONCAT11(
                                                  buf[9],buf[8]))) == -0x7d1c0000) {
                                                    if (CONCAT13(buf[0xf],CONCAT12(buf[0xe],CONCAT11
                                                  (buf[0xd],buf[0xc]))) == 0) {
                                                    if (local_28 == 0x53) {
                                                      lrtr_ip_addr_to_str((lrtr_ip_addr *)buf,
                                                                          (char *)&addr,0x2e);
                                                      iVar1 = bcmp("fdf8:f53b:82e4::53",&addr,0x13);
                                                      if (iVar1 == 0) {
                                                        lrtr_ip_str_to_addr(
                                                  "fe80::200:5aee:feaa:20a2",(lrtr_ip_addr *)buf);
                                                  if (CONCAT13(buf[7],CONCAT12(buf[6],CONCAT11(buf[5
                                                  ],buf[4]))) == -0x1800000) {
                                                    if (CONCAT13(buf[0xb],CONCAT12(buf[10],CONCAT11(
                                                  buf[9],buf[8]))) == 0) {
                                                    if (CONCAT13(buf[0xf],CONCAT12(buf[0xe],CONCAT11
                                                  (buf[0xd],buf[0xc]))) == 0x2005aee) {
                                                    __assertion = 
                                                  "addr.u.addr6.addr[3] == 0xfeaa20a2";
                                                  __function = "void test_v6(void)";
                                                  __line = 0x5e;
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "addr.u.addr6.addr[2] == 0x2005aee";
                                                  __function = "void test_v6(void)";
                                                  __line = 0x5d;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "addr.u.addr6.addr[1] == 0";
                                                    __function = "void test_v6(void)";
                                                    __line = 0x5c;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "addr.u.addr6.addr[0] == 0xfe800000";
                                                  __function = "void test_v6(void)";
                                                  __line = 0x5b;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "strcmp(\"fdf8:f53b:82e4::53\", buf) == 0";
                                                  __function = "void test_v6(void)";
                                                  __line = 0x58;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "addr.u.addr6.addr[3] == 0x53";
                                                    __function = "void test_v6(void)";
                                                    __line = 0x56;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = "addr.u.addr6.addr[2] == 0";
                                                    __function = "void test_v6(void)";
                                                    __line = 0x55;
                                                  }
                                                  }
                                                  else {
                                                    __assertion = 
                                                  "addr.u.addr6.addr[1] == 0x82e40000";
                                                  __function = "void test_v6(void)";
                                                  __line = 0x54;
                                                  }
                                                }
                                                else {
                                                  __assertion = "addr.u.addr6.addr[0] == 0xfdf8f53b"
                                                  ;
                                                  __function = "void test_v6(void)";
                                                  __line = 0x53;
                                                }
                                              }
                                              else {
                                                __assertion = 
                                                "lrtr_ip_str_to_addr(\"8.4.5\", &addr) == -1";
                                                __function = "void test_v4(void)";
                                                __line = 0x47;
                                              }
                                            }
                                            else {
                                              __assertion = 
                                              "lrtr_ip_str_to_addr(\"8,3,4,5\", &addr) == -1";
                                              __function = "void test_v4(void)";
                                              __line = 0x46;
                                            }
                                          }
                                          else {
                                            __assertion = "strcmp(\"8.9.6.3\", buf) == 0";
                                            __function = "void test_v4(void)";
                                            __line = 0x43;
                                          }
                                        }
                                        else {
                                          __assertion = "addr.u.addr4.addr == 0x8090603";
                                          __function = "void test_v4(void)";
                                          __line = 0x41;
                                        }
                                      }
                                      else {
                                        __assertion = "addr.ver == LRTR_IPV4";
                                        __function = "void test_v4(void)";
                                        __line = 0x40;
                                      }
                                    }
                                    else {
                                      __assertion = "strcmp(\"5.0.255.255\", buf) == 0";
                                      __function = "void test_v4(void)";
                                      __line = 0x3d;
                                    }
                                  }
                                  else {
                                    __assertion = "addr.u.addr4.addr == 0x500ffff";
                                    __function = "void test_v4(void)";
                                    __line = 0x3b;
                                  }
                                }
                                else {
                                  __assertion = "addr.ver == LRTR_IPV4";
                                  __function = "void test_v4(void)";
                                  __line = 0x3a;
                                }
                              }
                              else {
                                __assertion = "strcmp(\"1.1.1.1\", buf) == 0";
                                __function = "void test_v4(void)";
                                __line = 0x37;
                              }
                            }
                            else {
                              __assertion = "addr.u.addr4.addr == 0x1010101";
                              __function = "void test_v4(void)";
                              __line = 0x35;
                            }
                          }
                          else {
                            __assertion = "addr.ver == LRTR_IPV4";
                            __function = "void test_v4(void)";
                            __line = 0x34;
                          }
                        }
                        else {
                          __assertion = "strcmp(\"78.69.255.0\", buf) == 0";
                          __function = "void test_v4(void)";
                          __line = 0x31;
                        }
                      }
                      else {
                        __assertion = "addr.u.addr4.addr == 0x4e45ff00";
                        __function = "void test_v4(void)";
                        __line = 0x2f;
                      }
                    }
                    else {
                      __assertion = "addr.ver == LRTR_IPV4";
                      __function = "void test_v4(void)";
                      __line = 0x2e;
                    }
                  }
                  else {
                    __assertion = "strcmp(\"0.2.6.7\", buf) == 0";
                    __function = "void test_v4(void)";
                    __line = 0x2b;
                  }
                }
                else {
                  __assertion = "addr.u.addr4.addr == 0x20607";
                  __function = "void test_v4(void)";
                  __line = 0x29;
                }
              }
              else {
                __assertion = "addr.ver == LRTR_IPV4";
                __function = "void test_v4(void)";
                __line = 0x28;
              }
            }
            else {
              __assertion = "strcmp(\"255.255.255.255\", buf) == 0";
              __function = "void test_v4(void)";
              __line = 0x25;
            }
          }
          else {
            __assertion = "addr.u.addr4.addr == 0xffffffff";
            __function = "void test_v4(void)";
            __line = 0x23;
          }
        }
        else {
          __assertion = "addr.ver == LRTR_IPV4";
          __function = "void test_v4(void)";
          __line = 0x22;
        }
      }
      else {
        __assertion = "strcmp(\"0.0.0.0\", buf) == 0";
        __function = "void test_v4(void)";
        __line = 0x1f;
      }
    }
    else {
      __assertion = "addr.u.addr4.addr == 0";
      __function = "void test_v4(void)";
      __line = 0x1d;
    }
  }
  else {
    __assertion = "addr.ver == LRTR_IPV4";
    __function = "void test_v4(void)";
    __line = 0x1c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_ipaddr.c"
                ,__line,__function);
}

Assistant:

int main(void)
{
	test_v4();
	test_v6();
	test_cmp();
	printf("Test successful\n");
	return EXIT_SUCCESS;
}